

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O3

void __thiscall
capnp::compiler::LineBreakTable::LineBreakTable(LineBreakTable *this,ArrayPtr<const_char> content)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  size_t newSize;
  char *pcVar5;
  char *pos;
  char *pcVar6;
  
  uVar3 = content.size_;
  pcVar6 = content.ptr;
  puVar2 = (uint *)kj::_::HeapArrayDisposer::allocateImpl
                             (4,0,uVar3 / 0x28,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                             );
  (this->lineBreaks).builder.ptr = puVar2;
  (this->lineBreaks).builder.pos = puVar2;
  (this->lineBreaks).builder.endPtr = puVar2 + uVar3 / 0x28;
  (this->lineBreaks).builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  if (uVar3 < 0x28) {
    kj::Vector<unsigned_int>::setCapacity(&this->lineBreaks,4);
    puVar2 = (this->lineBreaks).builder.pos;
  }
  *puVar2 = 0;
  puVar2 = puVar2 + 1;
  (this->lineBreaks).builder.pos = puVar2;
  if (0 < (long)uVar3) {
    pcVar5 = pcVar6 + uVar3;
    uVar4 = 1;
    do {
      if (*pcVar6 == '\n') {
        if (puVar2 == (this->lineBreaks).builder.endPtr) {
          puVar1 = (this->lineBreaks).builder.ptr;
          newSize = (long)puVar2 - (long)puVar1 >> 1;
          if (puVar2 == puVar1) {
            newSize = 4;
          }
          kj::Vector<unsigned_int>::setCapacity(&this->lineBreaks,newSize);
          puVar2 = (this->lineBreaks).builder.pos;
        }
        *puVar2 = uVar4;
        puVar2 = puVar2 + 1;
        (this->lineBreaks).builder.pos = puVar2;
      }
      pcVar6 = pcVar6 + 1;
      uVar4 = uVar4 + 1;
    } while (pcVar6 < pcVar5);
  }
  return;
}

Assistant:

LineBreakTable::LineBreakTable(kj::ArrayPtr<const char> content)
    : lineBreaks(content.size() / 40) {
  lineBreaks.add(0);
  for (const char* pos = content.begin(); pos < content.end(); ++pos) {
    if (*pos == '\n') {
      lineBreaks.add(pos + 1 - content.begin());
    }
  }
}